

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Value offset_from_owner_procedure(Am_Object *self)

{
  long *plVar1;
  float fVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  double dVar7;
  Am_Value AVar8;
  Am_Object owner;
  Am_Object local_20;
  long *plVar6;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_20,in_SI,10);
  bVar4 = Am_Object::Valid(&local_20);
  if (bVar4) {
    iVar5 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    in_value = Am_Object::Get(&local_20,*(Am_Slot_Key *)((long)plVar6 + 0xc),0);
    Am_Value::operator=((Am_Value *)self,in_value);
    plVar1 = plVar6 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar6 + 0x20))(plVar6);
    }
    iVar5 = (int)plVar6[2];
    fVar2 = *(float *)((long)plVar6 + 0x14);
    uVar3 = *(ushort *)&self->data;
    if (uVar3 - 2 < 2) {
      self[1].data = (Am_Object_Data *)((long)(fVar2 * (float)(long)self[1].data) + (long)iVar5);
    }
    else if (uVar3 == 5) {
      *(float *)&self[1].data = fVar2 * *(float *)&self[1].data + (float)iVar5;
    }
    else if (uVar3 == 0x8006) {
      dVar7 = Am_Value::operator_cast_to_double((Am_Value *)self);
      Am_Value::operator=((Am_Value *)self,dVar7 * (double)fVar2 + (double)iVar5);
    }
  }
  else {
    Am_Value::Set_Value_Type((Am_Value *)self,1);
  }
  Am_Object::~Am_Object(&local_20);
  AVar8.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar8._0_8_ = self;
  return AVar8;
}

Assistant:

static Am_Value
offset_from_owner_procedure(Am_Object &self)
{
  Am_Value value;
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    Key_Offset_Store_Data *store =
        (Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
    value = owner.Get(store->key);
    store->Release();
    modify_value(value, store->offset, store->multiplier);
  } else
    value.Set_Value_Type(Am_ZERO); //not there, return a ZERO type
  return value;
}